

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testSelectedEncodes(void)

{
  uint uVar1;
  int iVar2;
  uint local_4c;
  int total;
  int i;
  double lon;
  double lat;
  char mapcode [29];
  int nrTests;
  
  local_4c = 0;
  do {
    uVar1 = encodeLatLonToSelectedMapcode((char *)&lat,52.158993,4.492346,TERRITORY_NONE,0,local_4c)
    ;
    if (uVar1 != 4) {
      foundError();
      printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d",4,
             (ulong)uVar1);
    }
    switch(local_4c) {
    case 0:
      iVar2 = strcmp((char *)&lat,"NLD QJM.0G");
      if (iVar2 != 0) {
        foundError();
        printf("*** ERROR *** testSelectedEncodes, expected \'%s\', but got \'%s\', alternative %d\n"
               ,"NLD QJM.0G",&lat,(ulong)local_4c);
      }
      break;
    case 1:
      iVar2 = strcmp((char *)&lat,"NLD CZQ.15C");
      if (iVar2 != 0) {
        foundError();
        printf("*** ERROR *** testSelectedEncodes, expected \'%s\', but got \'%s\', alternative %d\n"
               ,"NLD CZQ.15C",&lat,(ulong)local_4c);
      }
      break;
    case 2:
      iVar2 = strcmp((char *)&lat,"NLD N39J.MZN");
      if (iVar2 != 0) {
        foundError();
        printf("*** ERROR *** testSelectedEncodes, expected \'%s\', but got \'%s\', alternative %d\n"
               ,"NLD N39J.MZN",&lat,(ulong)local_4c);
      }
      break;
    case 3:
      iVar2 = strcmp((char *)&lat,"VHVN4.TZ9S");
      if (iVar2 != 0) {
        foundError();
        printf("*** ERROR *** testSelectedEncodes, expected \'%s\', but got \'%s\', alternative %d\n"
               ,"VHVN4.TZ9S",&lat,(ulong)local_4c);
      }
      break;
    default:
      foundError();
      printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d",4,
             (ulong)local_4c);
    }
    local_4c = local_4c + 1;
  } while ((int)local_4c < (int)uVar1);
  return 1;
}

Assistant:

static int testSelectedEncodes(void) {
    int nrTests = 0;
    char mapcode[MAX_MAPCODE_RESULT_ASCII_LEN];
    double lat = 52.158993;
    double lon = 4.492346;
    int i = 0;
    int total = 0;
    do {
        total = encodeLatLonToSelectedMapcode(mapcode, lat, lon, TERRITORY_NONE, 0, i);
        if (total != 4) {
            foundError();
            printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d", 4, total);
        }
        switch (i) {
        case 0:
            if (strcmp(mapcode, "NLD QJM.0G") != 0) {
                foundError();
                printf("*** ERROR *** testSelectedEncodes, expected '%s', but got '%s', alternative %d\n", "NLD QJM.0G", mapcode, i);
            }
            break;
        case 1:
            if (strcmp(mapcode, "NLD CZQ.15C") != 0) {
                foundError();
                printf("*** ERROR *** testSelectedEncodes, expected '%s', but got '%s', alternative %d\n", "NLD CZQ.15C", mapcode, i);
            }
            break;
        case 2:
            if (strcmp(mapcode, "NLD N39J.MZN") != 0) {
                foundError();
                printf("*** ERROR *** testSelectedEncodes, expected '%s', but got '%s', alternative %d\n", "NLD N39J.MZN", mapcode, i);
            }
            break;
        case 3:
            if (strcmp(mapcode, "VHVN4.TZ9S") != 0) {
                foundError();
                printf("*** ERROR *** testSelectedEncodes, expected '%s', but got '%s', alternative %d\n", "VHVN4.TZ9S", mapcode, i);
            }
            break;
        default:
            foundError();
            printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d", 4, i);
            break;
        }
        ++i;
    } while (i < total);
    ++nrTests;
    return nrTests;
}